

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<double,double,double,duckdb::BothInclusiveBetweenOperator,true,true,true>
                (double *adata,double *bdata,double *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  idx_t iVar2;
  long lVar3;
  idx_t iVar4;
  idx_t i;
  idx_t iVar5;
  double in_stack_ffffffffffffffa8;
  
  lVar3 = 0;
  iVar2 = 0;
  for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
    iVar4 = iVar5;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)result_sel->sel_vector[iVar5];
    }
    bVar1 = BothInclusiveBetweenOperator::Operation<double>
                      (in_stack_ffffffffffffffa8,(double)bdata,1.24045615054885e-316);
    true_sel->sel_vector[iVar2] = (sel_t)iVar4;
    iVar2 = iVar2 + bVar1;
    false_sel->sel_vector[lVar3] = (sel_t)iVar4;
    lVar3 = lVar3 + (ulong)!bVar1;
  }
  return iVar2;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}